

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O3

void __thiscall QSizeGrip::mouseMoveEvent(QSizeGrip *this,QMouseEvent *e)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  QRect local_38;
  QSize local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(e + 0x44) == 1) &&
     (lVar2 = *(long *)&(this->super_QWidget).field_0x8, *(char *)(lVar2 + 0x290) == '\0')) {
    do {
      uVar1 = (((this->super_QWidget).data)->window_flags).
              super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i;
      if (((uVar1 & 1) != 0) || ((uVar1 & 0xff) == 0x12)) goto LAB_00475739;
      this = *(QSizeGrip **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
    } while (&this->super_QWidget != (QWidget *)0x0);
    this = (QSizeGrip *)0x0;
LAB_00475739:
    if (*(char *)(lVar2 + 0x27c) == '\x01') {
      bVar4 = QWidget::testAttribute_helper(&this->super_QWidget,WA_WState_ConfigPending);
      if (!bVar4) {
        auVar9 = QEventPoint::globalPosition();
        dVar8 = (double)((ulong)auVar9._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                auVar9._0_8_;
        bVar4 = 2147483647.0 < dVar8;
        if (dVar8 <= -2147483648.0) {
          dVar8 = -2147483648.0;
        }
        dVar7 = (double)((ulong)auVar9._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                auVar9._8_8_;
        bVar3 = 2147483647.0 < dVar7;
        if (dVar7 <= -2147483648.0) {
          dVar7 = -2147483648.0;
        }
        iVar5 = (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar7);
        if ((*(uint *)(lVar2 + 0x278) & 0xfffffffe) == 2) {
          iVar5 = iVar5 - *(int *)(lVar2 + 600);
          if (*(int *)(lVar2 + 0x274) <= iVar5) {
            iVar5 = *(int *)(lVar2 + 0x274);
          }
          iVar5 = (*(int *)(lVar2 + 0x268) - *(int *)(lVar2 + 0x260)) + iVar5;
        }
        else {
          iVar5 = iVar5 - *(int *)(lVar2 + 600);
          if (iVar5 <= *(int *)(lVar2 + 0x274)) {
            iVar5 = *(int *)(lVar2 + 0x274);
          }
          iVar5 = *(int *)(lVar2 + 0x268) - (*(int *)(lVar2 + 0x260) + iVar5);
        }
        iVar6 = (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar8);
        if ((*(uint *)(lVar2 + 0x278) & 0xfffffffd) == 0) {
          iVar6 = iVar6 - *(int *)(lVar2 + 0x254);
          if (iVar6 <= *(int *)(lVar2 + 0x270)) {
            iVar6 = *(int *)(lVar2 + 0x270);
          }
          iVar6 = *(int *)(lVar2 + 0x264) - (*(int *)(lVar2 + 0x25c) + iVar6);
        }
        else {
          iVar6 = iVar6 - *(int *)(lVar2 + 0x254);
          if (*(int *)(lVar2 + 0x270) <= iVar6) {
            iVar6 = *(int *)(lVar2 + 0x270);
          }
          iVar6 = (*(int *)(lVar2 + 0x264) - *(int *)(lVar2 + 0x25c)) + iVar6;
        }
        local_28.ht.m_i = iVar5 + 1;
        local_28.wd.m_i = iVar6 + 1;
        local_28 = QLayout::closestAcceptableSize(&this->super_QWidget,&local_28);
        iVar6 = local_28.wd.m_i.m_i + -1;
        iVar5 = local_28.ht.m_i.m_i + -1;
        uVar1 = *(uint *)(lVar2 + 0x278);
        if ((uVar1 & 0xfffffffe) == 2) {
          if ((uVar1 & 1) == 0) {
            local_38.y2.m_i = iVar5 + *(int *)(lVar2 + 0x260);
            local_38.x2.m_i = *(int *)(lVar2 + 0x264);
            local_38.y1.m_i = *(int *)(lVar2 + 0x260);
            local_38.x1.m_i = *(int *)(lVar2 + 0x264) - iVar6;
          }
          else {
            local_38._0_8_ = *(undefined8 *)(lVar2 + 0x25c);
            local_38.y2.m_i = iVar5 + local_38.y1.m_i;
            local_38.x2.m_i = iVar6 + local_38.x1.m_i;
          }
        }
        else if ((uVar1 & 0xfffffffd) == 0) {
          local_38._8_8_ = *(undefined8 *)(lVar2 + 0x264);
          local_38.y1.m_i = local_38.y2.m_i - iVar5;
          local_38.x1.m_i = local_38.x2.m_i - iVar6;
        }
        else {
          local_38.y1.m_i = *(int *)(lVar2 + 0x268) - iVar5;
          local_38.x1.m_i = *(int *)(lVar2 + 0x25c);
          local_38.y2.m_i = *(int *)(lVar2 + 0x268);
          local_38.x2.m_i = iVar6 + *(int *)(lVar2 + 0x25c);
        }
        QWidget::setGeometry(&this->super_QWidget,&local_38);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QWidget::mouseMoveEvent(&this->super_QWidget,e);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSizeGrip::mouseMoveEvent(QMouseEvent * e)
{
    Q_D(QSizeGrip);
    if (e->buttons() != Qt::LeftButton || d->m_platformSizeGrip) {
        QWidget::mouseMoveEvent(e);
        return;
    }

    QWidget* tlw = qt_sizegrip_topLevelWidget(this);
    if (!d->gotMousePress || tlw->testAttribute(Qt::WA_WState_ConfigPending))
        return;

    QPoint np(e->globalPosition().toPoint());

    // Don't extend beyond the available geometry; bound to dyMax and dxMax.
    QSize ns;
    if (d->atBottom())
        ns.rheight() = d->r.height() + qMin(np.y() - d->p.y(), d->dyMax);
    else
        ns.rheight() = d->r.height() - qMax(np.y() - d->p.y(), d->dyMax);

    if (d->atLeft())
        ns.rwidth() = d->r.width() - qMax(np.x() - d->p.x(), d->dxMax);
    else
        ns.rwidth() = d->r.width() + qMin(np.x() - d->p.x(), d->dxMax);

    ns = QLayout::closestAcceptableSize(tlw, ns);

    QPoint p;
    QRect nr(p, ns);
    if (d->atBottom()) {
        if (d->atLeft())
            nr.moveTopRight(d->r.topRight());
        else
            nr.moveTopLeft(d->r.topLeft());
    } else {
        if (d->atLeft())
            nr.moveBottomRight(d->r.bottomRight());
        else
            nr.moveBottomLeft(d->r.bottomLeft());
    }

    tlw->setGeometry(nr);
}